

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall MlmWrap::close(MlmWrap *this,int __fd)

{
  zactor_t *self;
  int iVar1;
  
  self = this->actor;
  if (self != (zactor_t *)0x0) {
    zactor_destroy(&this->actor);
    iVar1 = zsock_wait(self);
    return iVar1;
  }
  iVar1 = mlm_client_destroy(&this->client);
  return iVar1;
}

Assistant:

void MlmWrap::close(){
    if(actor){
        zactor_t *a = actor;
        zactor_destroy(&actor);
        zsock_wait(a);
    }
    else
        mlm_client_destroy(&client);
    //Destroying actor causes the rest of cleanup to happen in message_reactor_task
}